

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saslclientio.c
# Opt level: O1

void on_underlying_io_open_complete(void *context,IO_OPEN_RESULT open_result)

{
  char *pcVar1;
  char *pcVar2;
  char *__s;
  char **ppcVar3;
  char **ppcVar4;
  int iVar5;
  MAP_RESULT MVar6;
  STRING_HANDLE handle;
  size_t sVar7;
  size_t sVar8;
  code *UNRECOVERED_JUMPTABLE_00;
  char *__s_00;
  char *__s_01;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  char *__s_02;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  long lVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  size_t sVar15;
  char **values;
  char **keys;
  char **local_68;
  char **local_60;
  size_t local_58;
  size_t local_50;
  uchar nonce [16];
  
  if (context == (void *)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
      return;
    }
    (*UNRECOVERED_JUMPTABLE)
              (AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
               ,"on_underlying_io_open_complete",0x2ee,1,"NULL context");
    return;
  }
  if (*(int *)((long)context + 0x40) == 1) {
    if (open_result == IO_OPEN_OK) {
      lVar12 = 0;
      do {
        iVar5 = RANDOM_generate();
        nonce[lVar12] = (uchar)iVar5;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x10);
      handle = Azure_Base64_Encode_Bytes(nonce,0x10);
      if (handle == (STRING_HANDLE)0x0) {
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          (*UNRECOVERED_JUMPTABLE)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
                     ,"on_underlying_io_open_complete",0x31d,1,
                     "Cannot construct the WebSocket upgrade request");
        }
        *(undefined4 *)((long)context + 0x40) = 0;
        uVar14 = *(undefined8 *)((long)context + 0x50);
        uVar13 = 0xf;
      }
      else {
        MVar6 = Map_GetInternals(*(MAP_HANDLE *)((long)context + 0x38),&keys,&values,&local_50);
        ppcVar4 = keys;
        ppcVar3 = values;
        if (MVar6 == MAP_OK) {
          if (local_50 == 0) {
            lVar12 = 0;
          }
          else {
            lVar12 = 0;
            sVar15 = 0;
            do {
              sVar7 = strlen(ppcVar4[sVar15]);
              sVar8 = strlen(ppcVar3[sVar15]);
              lVar12 = sVar8 + sVar7 + lVar12 + 4;
              sVar15 = sVar15 + 1;
            } while (local_50 != sVar15);
          }
          sVar7 = 0xffffffffffffffff;
          if (lVar12 + 1U != 0) {
            sVar7 = lVar12 + 1U;
          }
          if ((sVar7 == 0xffffffffffffffff) ||
             (__s_00 = (char *)malloc(sVar7), __s_00 == (char *)0x0)) {
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              (*UNRECOVERED_JUMPTABLE)
                        (AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
                         ,"get_request_headers",0x2cb,1,
                         "Failed allocating string for request headers, size=%zu",sVar7);
            }
            __s_00 = (char *)0x0;
          }
          else {
            if (local_50 == 0) {
              lVar12 = 0;
            }
            else {
              local_60 = keys;
              local_68 = values;
              lVar12 = 0;
              sVar15 = 0;
              local_58 = local_50;
              do {
                pcVar1 = local_60[sVar15];
                sVar7 = strlen(pcVar1);
                pcVar2 = local_68[sVar15];
                sVar8 = strlen(pcVar2);
                memcpy(__s_00 + lVar12,pcVar1,sVar7);
                lVar12 = sVar7 + lVar12;
                (__s_00 + lVar12)[0] = ':';
                (__s_00 + lVar12)[1] = ' ';
                memcpy(__s_00 + lVar12 + 2,pcVar2,sVar8);
                (__s_00 + lVar12 + sVar8 + 2)[0] = '\r';
                (__s_00 + lVar12 + sVar8 + 2)[1] = '\n';
                lVar12 = lVar12 + sVar8 + 4;
                sVar15 = sVar15 + 1;
              } while (local_58 != sVar15);
            }
            __s_00[lVar12] = '\0';
          }
        }
        else {
          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
          if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
            __s_00 = (char *)0x0;
          }
          else {
            __s_00 = (char *)0x0;
            (*UNRECOVERED_JUMPTABLE)
                      (AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
                       ,"get_request_headers",0x2b9,1,"Failed getting the request headers");
          }
        }
        if (__s_00 != (char *)0x0) {
          __s_01 = STRING_c_str(handle);
          pcVar1 = *(char **)((long)context + 0x18);
          sVar7 = strlen(pcVar1);
          pcVar2 = *(char **)((long)context + 0x10);
          sVar8 = strlen(pcVar2);
          sVar9 = strlen(__s_01);
          __s = (char *)**(undefined8 **)((long)context + 0x20);
          sVar10 = strlen(__s);
          sVar11 = strlen(__s_00);
          iVar5 = (int)sVar11 + (int)sVar10 + (int)sVar9 + (int)sVar8 + (int)sVar7;
          if (iVar5 + 0x9e < 0) {
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              (*UNRECOVERED_JUMPTABLE)
                        (AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
                         ,"on_underlying_io_open_complete",0x345,1,
                         "Cannot construct the WebSocket upgrade request");
            }
            xio_close(*(XIO_HANDLE *)((long)context + 8),(ON_IO_CLOSE_COMPLETE)0x0,(void *)0x0);
            *(undefined4 *)((long)context + 0x40) = 0;
            (**(code **)((long)context + 0x48))(*(undefined8 *)((long)context + 0x50),8);
          }
          else {
            __s_02 = (char *)malloc((ulong)(iVar5 + 0x9f));
            if (__s_02 == (char *)0x0) {
              UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
              if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                (*UNRECOVERED_JUMPTABLE)
                          (AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
                           ,"on_underlying_io_open_complete",0x34f,1,
                           "Cannot allocate memory for the WebSocket upgrade request");
              }
              xio_close(*(XIO_HANDLE *)((long)context + 8),(ON_IO_CLOSE_COMPLETE)0x0,(void *)0x0);
              *(undefined4 *)((long)context + 0x40) = 0;
              (**(code **)((long)context + 0x48))(*(undefined8 *)((long)context + 0x50),4);
            }
            else {
              iVar5 = sprintf(__s_02,
                              "GET %s HTTP/1.1\r\nHost: %s:%d\r\nUpgrade: websocket\r\nConnection: Upgrade\r\nSec-WebSocket-Key: %s\r\nSec-WebSocket-Protocol: %s\r\nSec-WebSocket-Version: 13\r\n%s\r\n"
                              ,pcVar1,pcVar2,(ulong)*(uint *)((long)context + 0x30),__s_01,__s,
                              __s_00);
              iVar5 = xio_send(*(XIO_HANDLE *)((long)context + 8),__s_02,(long)iVar5,
                               unchecked_on_send_complete,(void *)0x0);
              if (iVar5 == 0) {
                *(undefined4 *)((long)context + 0x40) = 2;
              }
              else {
                UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                  (*UNRECOVERED_JUMPTABLE)
                            (AZ_LOG_ERROR,
                             "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
                             ,"on_underlying_io_open_complete",0x363,1,"Cannot send upgrade request"
                            );
                }
                xio_close(*(XIO_HANDLE *)((long)context + 8),(ON_IO_CLOSE_COMPLETE)0x0,(void *)0x0);
                *(undefined4 *)((long)context + 0x40) = 0;
                (**(code **)((long)context + 0x48))(*(undefined8 *)((long)context + 0x50),6);
              }
              free(__s_02);
            }
          }
          STRING_delete(handle);
          free(__s_00);
          return;
        }
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          (*UNRECOVERED_JUMPTABLE)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
                     ,"on_underlying_io_open_complete",0x322,1,
                     "Cannot construct the WebSocket request headers");
        }
        *(undefined4 *)((long)context + 0x40) = 0;
        uVar14 = *(undefined8 *)((long)context + 0x50);
        uVar13 = 8;
      }
      (**(code **)((long)context + 0x48))(uVar14,uVar13);
      return;
    }
    if (open_result == IO_OPEN_CANCELLED) {
      *(undefined4 *)((long)context + 0x40) = 0;
      UNRECOVERED_JUMPTABLE_00 = *(code **)((long)context + 0x48);
      uVar14 = *(undefined8 *)((long)context + 0x50);
      uVar13 = 3;
    }
    else {
      *(undefined4 *)((long)context + 0x40) = 0;
      UNRECOVERED_JUMPTABLE_00 = *(code **)((long)context + 0x48);
      uVar14 = *(undefined8 *)((long)context + 0x50);
      uVar13 = 2;
    }
  }
  else {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
                 ,"on_underlying_io_open_complete",0x2f7,1,
                 "underlying on_io_open_complete was called again after upgrade request was sent.");
    }
    xio_close(*(XIO_HANDLE *)((long)context + 8),(ON_IO_CLOSE_COMPLETE)0x0,(void *)0x0);
    *(undefined4 *)((long)context + 0x40) = 0;
    UNRECOVERED_JUMPTABLE_00 = *(code **)((long)context + 0x48);
    uVar14 = *(undefined8 *)((long)context + 0x50);
    uVar13 = 7;
  }
  (*UNRECOVERED_JUMPTABLE_00)(uVar14,uVar13);
  return;
}

Assistant:

static void on_underlying_io_open_complete(void* context, IO_OPEN_RESULT open_result)
{
    SASL_CLIENT_IO_INSTANCE* sasl_client_io_instance = (SASL_CLIENT_IO_INSTANCE*)context;

    switch (sasl_client_io_instance->io_state)
    {
    default:
        LogError("Open complete received in unexpected state");
        break;

    case IO_STATE_SASL_HANDSHAKE:
        /* Codes_SRS_SASLCLIENTIO_01_110: [raise ERROR] */
    case IO_STATE_OPEN:
        /* Codes_SRS_SASLCLIENTIO_01_106: [raise error] */
        handle_error(sasl_client_io_instance);
        break;

    case IO_STATE_OPENING_UNDERLYING_IO:
        if (open_result == IO_OPEN_OK)
        {
            sasl_client_io_instance->io_state = IO_STATE_SASL_HANDSHAKE;
            if (sasl_client_io_instance->sasl_header_exchange_state != SASL_HEADER_EXCHANGE_IDLE)
            {
                /* Codes_SRS_SASLCLIENTIO_01_116: [If the underlying IO indicates another open while the after the header exchange has been started an error shall be indicated by calling `on_io_error`.]*/
                handle_error(sasl_client_io_instance);
            }
            else
            {
                /* Codes_SRS_SASLCLIENTIO_01_105: [start header exchange] */
                /* Codes_SRS_SASLCLIENTIO_01_001: [To establish a SASL layer, each peer MUST start by sending a protocol header.] */
                if (send_sasl_header(sasl_client_io_instance) != 0)
                {
                    /* Codes_SRS_SASLCLIENTIO_01_073: [If the handshake fails (i.e. the outcome is an error) the `on_io_open_complete` callback shall be triggered with `IO_OPEN_ERROR`.]*/
                    /* Codes_SRS_SASLCLIENTIO_01_077: [If sending the SASL header fails, the `on_io_open_complete` callback shall be triggered with `IO_OPEN_ERROR`.]*/
                    handle_error(sasl_client_io_instance);
                }
                else
                {
                    sasl_client_io_instance->sasl_header_exchange_state = SASL_HEADER_EXCHANGE_HEADER_SENT;
                }
            }
        }
        else
        {
            handle_error(sasl_client_io_instance);
        }

        break;
    }
}